

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O1

QString * QSysInfo::productVersion(void)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QUnixOSVersion unixOsVersion;
  QUnixOSVersion local_58;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.productType.d.d = (Data *)0x0;
  local_58.productType.d.ptr = (char16_t *)0x0;
  local_58.productType.d.size = 0;
  local_58.productVersion.d.d = (Data *)0x0;
  local_58.productVersion.d.ptr = (char16_t *)0x0;
  local_58.productVersion.d.size = 0;
  local_58.prettyName.d.d = (Data *)0x0;
  local_58.prettyName.d.ptr = (char16_t *)0x0;
  local_58.prettyName.d.size = 0;
  findUnixOsVersion(&local_58);
  if (local_58.productVersion.d.size == 0) {
    (in_RDI->d).d = (Data *)0x0;
    (in_RDI->d).ptr = L"unknown";
    (in_RDI->d).size = 7;
  }
  else {
    (in_RDI->d).d = local_58.productVersion.d.d;
    (in_RDI->d).ptr = local_58.productVersion.d.ptr;
    (in_RDI->d).size = local_58.productVersion.d.size;
    if (&(local_58.productVersion.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.productVersion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           = ((local_58.productVersion.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (&(local_58.prettyName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.prettyName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.prettyName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_58.prettyName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_58.prettyName.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.productVersion.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.productVersion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.productVersion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if (((local_58.productVersion.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_58.productVersion.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.productType.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.productType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.productType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_58.productType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_58.productType.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSysInfo::productVersion()
{
#if defined(Q_OS_ANDROID) || defined(Q_OS_DARWIN)
    const auto version = QOperatingSystemVersion::current();
    return QString::asprintf("%d.%d", version.majorVersion(), version.minorVersion());
#elif defined(Q_OS_WIN)
    const char *version = osVer_helper();
    if (version) {
        const QLatin1Char spaceChar(' ');
        return QString::fromLatin1(version).remove(spaceChar).toLower() + winSp_helper().remove(spaceChar).toLower();
    }
    // fall through

#elif defined(Q_OS_VXWORKS)
    utsname u;
    if (uname(&u) == 0)
        return QString::fromLatin1(u.releaseversion);
    // fall through

#elif defined(USE_ETC_OS_RELEASE) // Q_OS_UNIX
    QUnixOSVersion unixOsVersion;
    findUnixOsVersion(unixOsVersion);
    if (!unixOsVersion.productVersion.isEmpty())
        return unixOsVersion.productVersion;
#endif

    // fallback
    return unknownText();
}